

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagelayout.cpp
# Opt level: O1

bool __thiscall
QPageLayout::setRightMargin(QPageLayout *this,qreal rightMargin,OutOfBoundsPolicy outOfBoundsPolicy)

{
  QPageLayoutPrivate *pQVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  pQVar1 = (this->d).d.ptr;
  if (outOfBoundsPolicy == Clamp && pQVar1->m_mode == StandardMode) {
    dVar6 = (pQVar1->m_maxMargins).m_right;
    if (rightMargin <= dVar6) {
      dVar6 = rightMargin;
    }
    dVar8 = (pQVar1->m_minMargins).m_right;
    rightMargin = dVar6;
    if (dVar6 <= dVar8) {
      rightMargin = dVar8;
    }
  }
  dVar6 = (pQVar1->m_margins).m_right;
  dVar7 = rightMargin - dVar6;
  uVar3 = -(ulong)(dVar7 < -dVar7);
  uVar4 = -(ulong)(rightMargin < -rightMargin);
  uVar5 = -(ulong)(dVar6 < -dVar6);
  dVar8 = (double)(~uVar4 & (ulong)rightMargin | (ulong)-rightMargin & uVar4);
  dVar6 = (double)(~uVar5 & (ulong)dVar6 | (ulong)-dVar6 & uVar5);
  if (dVar6 <= dVar8) {
    dVar8 = dVar6;
  }
  bVar2 = true;
  if (dVar8 < (double)(~uVar3 & (ulong)dVar7 | (ulong)-dVar7 & uVar3) * 1000000000000.0) {
    if ((pQVar1->m_mode == FullPageMode) ||
       (((pQVar1->m_minMargins).m_right <= rightMargin &&
        (rightMargin <= (pQVar1->m_maxMargins).m_right)))) {
      if ((pQVar1 != (QPageLayoutPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QExplicitlySharedDataPointer<QPageLayoutPrivate>::detach_helper(&this->d);
      }
      (((this->d).d.ptr)->m_margins).m_right = rightMargin;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool QPageLayout::setRightMargin(qreal rightMargin, OutOfBoundsPolicy outOfBoundsPolicy)
{
    if (d->m_mode == StandardMode && outOfBoundsPolicy == OutOfBoundsPolicy::Clamp)
        rightMargin = qBound(d->m_minMargins.right(), rightMargin, d->m_maxMargins.right());

    if (qFuzzyCompare(rightMargin, d->m_margins.right()))
        return true;

    if (d->m_mode == FullPageMode
        || (rightMargin >= d->m_minMargins.right() && rightMargin <= d->m_maxMargins.right())) {
        d.detach();
        d->m_margins.setRight(rightMargin);
        return true;
    }

    return false;
}